

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::TaskSet::Task::Task(Task *this,OwnPromiseNode *nodeParam,TaskSet *taskSet)

{
  PromiseNode *pPVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  EventLoop *pEVar6;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0037fb40;
  (this->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
  uVar4 = (taskSet->location).lineNumber;
  uVar5 = (taskSet->location).columnNumber;
  pcVar2 = (taskSet->location).fileName;
  pcVar3 = (taskSet->location).function;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_0037fa40;
  pEVar6 = anon_unknown_173::currentEventLoop();
  (this->super_Event).loop = pEVar6;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event).live = 0x1e366381;
  local_38 = SUB84(pcVar2,0);
  uStack_34 = (undefined4)((ulong)pcVar2 >> 0x20);
  uStack_30 = SUB84(pcVar3,0);
  uStack_2c = (undefined4)((ulong)pcVar3 >> 0x20);
  *(undefined4 *)&(this->super_Event).location.fileName = local_38;
  *(undefined4 *)((long)&(this->super_Event).location.fileName + 4) = uStack_34;
  *(undefined4 *)&(this->super_Event).location.function = uStack_30;
  *(undefined4 *)((long)&(this->super_Event).location.function + 4) = uStack_2c;
  (this->super_Event).location.lineNumber = uVar4;
  (this->super_Event).location.columnNumber = uVar5;
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0037fb58;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_0037fb80;
  (this->next).ptr.ptr = (Task *)0x0;
  this->prev = (Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *)0x0;
  this->taskSet = taskSet;
  (this->node).ptr = nodeParam->ptr;
  nodeParam->ptr = (PromiseNode *)0x0;
  pPVar1 = (this->node).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->node);
  pPVar1 = (this->node).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

Task(_::OwnPromiseNode&& nodeParam, TaskSet& taskSet)
      : Event(taskSet.location), taskSet(taskSet), node(kj::mv(nodeParam)) {
    node->setSelfPointer(&node);
    node->onReady(this);
  }